

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task32.cpp
# Opt level: O3

void helper(string *tok,
           stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *temp,string *res)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  _Elt_pointer pbVar4;
  bool bVar5;
  int iVar6;
  size_type sVar7;
  _Elt_pointer pbVar8;
  ostream *poVar9;
  _Elt_pointer pbVar10;
  int iVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar2 = (tok->_M_dataplus)._M_p;
  sVar3 = tok->_M_string_length;
  if (sVar3 != 0) {
    sVar7 = 0;
    do {
      if (9 < (int)pcVar2[sVar7] - 0x30U) {
        iVar6 = std::__cxx11::string::compare((char *)tok);
        if (iVar6 == 0) {
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&temp->c,tok);
          return;
        }
        iVar6 = std::__cxx11::string::compare((char *)tok);
        if (iVar6 == 0) {
          pbVar8 = (temp->c).
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (pbVar8 == (temp->c).
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0010279c;
          goto LAB_001026cb;
        }
        bVar5 = is_bin(tok);
        if (!bVar5) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"invalid token ",0xe);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(tok->_M_dataplus)._M_p,tok->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          return;
        }
        pbVar8 = (temp->c).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pbVar8 == (temp->c).
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_00102680;
        goto LAB_00102554;
      }
      sVar7 = sVar7 + 1;
    } while (sVar3 != sVar7);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)local_50,pcVar2,pcVar2 + sVar3);
  std::__cxx11::string::append((char *)local_50);
  std::__cxx11::string::_M_append((char *)res,(ulong)local_50[0]);
  if (local_50[0] == local_40) {
    return;
  }
  operator_delete(local_50[0],local_40[0] + 1);
  return;
  while( true ) {
    if (pbVar8 == (temp->c).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pbVar8 = (temp->c).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
    }
    std::__cxx11::string::_M_append((char *)res,(ulong)pbVar8[-1]._M_dataplus._M_p);
    std::__cxx11::string::append((char *)res);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(&temp->c);
    pbVar8 = (temp->c).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pbVar8 == (temp->c).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) break;
LAB_001026cb:
    if (pbVar8 == (temp->c).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pbVar8 = (temp->c).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
    }
    iVar6 = std::__cxx11::string::compare((char *)(pbVar8 + -1));
    pbVar8 = (temp->c).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (iVar6 == 0) {
      if (pbVar8 != (temp->c).
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_001027b4;
      break;
    }
  }
LAB_0010279c:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"wrong bracer\n",0xd);
LAB_001027b4:
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(&temp->c);
  return;
  while( true ) {
    if (pbVar8 == pbVar4) {
      if (*(temp->c).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0xf]._M_dataplus._M_p == '^')
      break;
      pbVar8 = (temp->c).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
    }
    else if (*pbVar8[-1]._M_dataplus._M_p == '^') break;
    pcVar2 = pbVar8[-1]._M_dataplus._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar2,pcVar2 + pbVar8[-1]._M_string_length);
    std::__cxx11::string::append((char *)local_50);
    std::__cxx11::string::_M_append((char *)res,(ulong)local_50[0]);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(&temp->c);
    pbVar8 = (temp->c).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pbVar8 == (temp->c).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) break;
LAB_00102554:
    pbVar4 = (temp->c).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    pbVar10 = pbVar8;
    if (pbVar8 == pbVar4) {
      pbVar10 = (temp->c).
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
    }
    cVar1 = *pbVar10[-1]._M_dataplus._M_p;
    switch(cVar1) {
    case '*':
    case '/':
      iVar6 = 1;
      break;
    case '+':
    case '-':
      iVar6 = 0;
      break;
    case ',':
    case '.':
switchD_00102587_caseD_2c:
      iVar6 = -1;
      break;
    default:
      iVar6 = 2;
      if (cVar1 != '^') goto switchD_00102587_caseD_2c;
    }
    cVar1 = *(tok->_M_dataplus)._M_p;
    switch(cVar1) {
    case '*':
    case '/':
      iVar11 = 1;
      break;
    case '+':
    case '-':
      iVar11 = 0;
      break;
    case ',':
    case '.':
switchD_001025bf_caseD_2c:
      iVar11 = -1;
      break;
    default:
      iVar11 = 2;
      if (cVar1 != '^') goto switchD_001025bf_caseD_2c;
    }
    if (iVar6 < iVar11) break;
  }
LAB_00102680:
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&temp->c,tok);
  return;
}

Assistant:

void helper (const string& tok, stack<string>& temp, string& res) {
    if (is_num(tok)) res += tok + " ";
    else if (tok == "(") temp.push(tok);
    else if (tok == ")") {
        while (!temp.empty() && temp.top() != "(") {
            res += temp.top();
            res += " ";
            temp.pop();
        }
        if (temp.empty()) cout << "wrong bracer\n";
        temp.pop();
    } else if (is_bin(tok)) {
        while (!temp.empty() && (prior(temp.top()[0]) >= prior(tok[0])) && (prior(temp.top()[0]) != 2)) {
            res += temp.top() + " ";
            temp.pop();
        }
        temp.push(tok);
    } else cout << "invalid token " << tok << endl;
}